

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O3

int day2b::get_bathroom_code(string *input)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  string line;
  istringstream stream;
  byte *local_1d0;
  undefined8 local_1c8;
  byte local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  uVar7 = 2;
  iVar9 = 1;
  uVar8 = 0;
  uVar10 = 0;
  while (piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1d0),
        ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
    bVar2 = *local_1d0;
    pbVar5 = local_1d0;
    while (bVar2 != 0) {
      pbVar5 = pbVar5 + 1;
      if (bVar2 < 0x52) {
        if (bVar2 == 0x44) {
          if ((((int)uVar7 < 4) && ((int)uVar10 < 5)) && (-1 < (int)(uVar7 + 1 | uVar10))) {
            uVar7 = ((uint)(0x477dc4L >> ((char)(uVar7 + 1) * '\x05' + (char)uVar10 & 0x3fU)) & 1) +
                    uVar7;
          }
        }
        else if (((bVar2 == 0x4c) && ((int)uVar7 < 5)) &&
                (((int)uVar10 < 6 &&
                 ((uVar1 = uVar10 - 1, -1 < (int)(uVar7 | uVar1) &&
                  ((0x477dc4UL >> ((char)uVar7 * '\x05' + (char)uVar1 & 0x3fU) & 1) != 0)))))) {
          uVar10 = uVar1;
        }
      }
      else if (bVar2 == 0x52) {
        if ((((int)uVar7 < 5) && ((int)uVar10 < 4)) && (-1 < (int)(uVar7 | uVar10 + 1))) {
          uVar10 = ((uint)(0x477dc4L >> ((char)uVar7 * '\x05' + (char)(uVar10 + 1) & 0x3fU)) & 1) +
                   uVar10;
        }
      }
      else if (((bVar2 == 0x55) && ((int)uVar7 < 6)) &&
              (((int)uVar10 < 5 &&
               ((uVar1 = uVar7 - 1, -1 < (int)(uVar1 | uVar10) &&
                ((0x477dc4UL >> ((char)uVar1 * '\x05' + (char)uVar10 & 0x3fU) & 1) != 0)))))) {
        uVar7 = uVar1;
      }
      bVar2 = *pbVar5;
    }
    uVar8 = uVar8 + (char)keypad[(long)(int)uVar10 + (long)(int)uVar7 * 5] * iVar9;
    iVar9 = iVar9 << 4;
  }
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
    do {
      uVar7 = uVar7 << 4 | uVar8 & 0xf;
      uVar6 = uVar6 >> 4;
      bVar3 = 0xf < uVar8;
      uVar8 = (uint)uVar6;
    } while (bVar3);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return uVar7;
}

Assistant:

int get_bathroom_code(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		Position position{0,2};
		int code = 0;
		int i = 1;
		while(stream >> line) {
			const char* p = line.c_str();
			while(*p) {
				switch(*p++) {
				case 'U': if(is_valid(position.x, position.y - 1)) --position.y; break;
				case 'R': if(is_valid(position.x + 1, position.y)) ++position.x; break;
				case 'D': if(is_valid(position.x, position.y + 1)) ++position.y; break;
				case 'L': if(is_valid(position.x - 1, position.y)) --position.x; break;
				}
			}
			code += keypad[position.x + position.y * width] * i;
			i *= 16;
		}
		return reverse(code, 16);
	}